

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

die_range_info_iterator __thiscall
llvm::DWARFVerifier::DieRangeInfo::insert(DieRangeInfo *this,DieRangeInfo *RI)

{
  bool bVar1;
  pointer this_00;
  iterator iVar2;
  _Self local_30;
  iterator Iter;
  iterator End;
  DieRangeInfo *RI_local;
  DieRangeInfo *this_local;
  
  Iter = std::
         set<llvm::DWARFVerifier::DieRangeInfo,_std::less<llvm::DWARFVerifier::DieRangeInfo>,_std::allocator<llvm::DWARFVerifier::DieRangeInfo>_>
         ::end(&this->Children);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<llvm::DWARFVerifier::DieRangeInfo,_std::less<llvm::DWARFVerifier::DieRangeInfo>,_std::allocator<llvm::DWARFVerifier::DieRangeInfo>_>
       ::begin(&this->Children);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&Iter);
    if (!bVar1) {
      std::
      set<llvm::DWARFVerifier::DieRangeInfo,_std::less<llvm::DWARFVerifier::DieRangeInfo>,_std::allocator<llvm::DWARFVerifier::DieRangeInfo>_>
      ::insert(&this->Children,RI);
      iVar2 = std::
              set<llvm::DWARFVerifier::DieRangeInfo,_std::less<llvm::DWARFVerifier::DieRangeInfo>,_std::allocator<llvm::DWARFVerifier::DieRangeInfo>_>
              ::end(&this->Children);
      return (die_range_info_iterator)iVar2._M_node;
    }
    this_00 = std::_Rb_tree_const_iterator<llvm::DWARFVerifier::DieRangeInfo>::operator->(&local_30)
    ;
    bVar1 = intersects(this_00,RI);
    if (bVar1) break;
    std::_Rb_tree_const_iterator<llvm::DWARFVerifier::DieRangeInfo>::operator++(&local_30);
  }
  return (die_range_info_iterator)local_30._M_node;
}

Assistant:

DWARFVerifier::DieRangeInfo::die_range_info_iterator
DWARFVerifier::DieRangeInfo::insert(const DieRangeInfo &RI) {
  auto End = Children.end();
  auto Iter = Children.begin();
  while (Iter != End) {
    if (Iter->intersects(RI))
      return Iter;
    ++Iter;
  }
  Children.insert(RI);
  return Children.end();
}